

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

Pair<long,_int>
b_array::detach_item<Map::Pair<long,int>>(Array<Map::Pair<long,_int>_> *data,size_t *size)

{
  size_t sVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  Pair<long,_int> *pPVar4;
  Pair<long,_int> PVar5;
  
  if (*size != 0) {
    pPVar4 = Array<Map::Pair<long,_int>_>::operator[](data,*size - 1);
    uVar2 = pPVar4->key;
    uVar3 = pPVar4->value;
    PVar5.value = uVar3;
    PVar5.key = uVar2;
    pPVar4 = Array<Map::Pair<long,_int>_>::operator[](data,*size);
    pPVar4->key = 0;
    pPVar4->value = 0;
    sVar1 = *size;
    *size = sVar1 - 1;
    pPVar4 = Array<Map::Pair<long,_int>_>::operator[](data,sVar1 - 1);
    pPVar4->key = 0;
    pPVar4->value = 0;
    PVar5._12_4_ = 0;
    return PVar5;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jaasonw[P]Database/include/util/array/array_util.h"
                ,0x4c,
                "T b_array::detach_item(b_array::Array<T> &, size_t &) [T = Map::Pair<long, int>]");
}

Assistant:

T detach_item(b_array::Array<T>& data, size_t& size) {
    assert(size > 0);
    T item = data[size - 1];
    data[size] = T();
    data[--size] = T();
    return item;
}